

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  ulong uVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  cmConditionEvaluator *pcVar5;
  char *pcVar6;
  cmConditionEvaluator *pcVar7;
  cmState *pcVar8;
  cmCommand *pcVar9;
  string *psVar10;
  cmTarget *pcVar11;
  ostream *poVar12;
  cmTest *pcVar13;
  PolicyID id;
  cmExpandedCommandArgument *pcVar14;
  cmMakefile *pcVar15;
  int reducible;
  iterator argP1;
  iterator arg;
  iterator argP2;
  PolicyID pid;
  int local_224;
  iterator local_220;
  iterator local_218;
  iterator local_210;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  do {
    local_224 = 0;
    local_218._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_210._M_node = (_List_node_base *)0x0;
    while (local_218._M_node != (_List_node_base *)newArgs) {
      pcVar7 = (cmConditionEvaluator *)local_1a8;
      local_220._M_node = local_218._M_node;
      if ((local_218._M_node != (_List_node_base *)newArgs) &&
         (local_220._M_node = (local_218._M_node)->_M_next, local_210._M_node = local_220._M_node,
         local_220._M_node != (_List_node_base *)newArgs)) {
        local_210._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_220._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      }
      pcVar14 = (cmExpandedCommandArgument *)(local_218._M_node + 1);
      bVar3 = IsKeyword(this,&keyEXISTS_abi_cxx11_,pcVar14);
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar5 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_220._M_node + 1));
        bVar3 = cmsys::SystemTools::FileExists((char *)pcVar5);
        HandlePredicate(pcVar5,bVar3,&local_224,&local_218,newArgs,&local_220,&local_210);
      }
      bVar3 = IsKeyword(this,&keyIS_DIRECTORY_abi_cxx11_,pcVar14);
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_220._M_node + 1));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pcVar7,pcVar6,(allocator<char> *)&local_208);
        pcVar5 = pcVar7;
        bVar3 = cmsys::SystemTools::FileIsDirectory((string *)pcVar7);
        HandlePredicate(pcVar5,bVar3,&local_224,&local_218,newArgs,&local_220,&local_210);
        if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
      }
      bVar3 = IsKeyword(this,&keyIS_SYMLINK_abi_cxx11_,pcVar14);
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_220._M_node + 1));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pcVar7,pcVar6,(allocator<char> *)&local_208);
        bVar3 = cmsys::SystemTools::FileIsSymlink((string *)pcVar7);
        HandlePredicate(pcVar7,bVar3,&local_224,&local_218,newArgs,&local_220,&local_210);
        if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
      }
      bVar3 = IsKeyword(this,&keyIS_ABSOLUTE_abi_cxx11_,pcVar14);
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar7 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_220._M_node + 1));
        bVar3 = cmsys::SystemTools::FileIsFullPath((char *)pcVar7);
        HandlePredicate(pcVar7,bVar3,&local_224,&local_218,newArgs,&local_220,&local_210);
      }
      bVar3 = IsKeyword(this,&keyCOMMAND_abi_cxx11_,pcVar14);
      iVar2._M_node = local_220._M_node;
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar8 = cmMakefile::GetState(this->Makefile);
        pcVar6 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)(iVar2._M_node + 1));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,pcVar6,(allocator<char> *)&local_208);
        pcVar9 = cmState::GetCommand(pcVar8,(string *)local_1a8);
        pcVar15 = (cmMakefile *)local_1a8._0_8_;
        if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        HandlePredicate((cmConditionEvaluator *)pcVar15,pcVar9 != (cmCommand *)0x0,&local_224,
                        &local_218,newArgs,&local_220,&local_210);
      }
      bVar3 = IsKeyword(this,&keyPOLICY_abi_cxx11_,pcVar14);
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar7 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_220._M_node + 1));
        bVar3 = cmPolicies::GetPolicyID((char *)pcVar7,(PolicyID *)local_1a8);
        HandlePredicate(pcVar7,bVar3,&local_224,&local_218,newArgs,&local_220,&local_210);
      }
      bVar3 = IsKeyword(this,&keyTARGET_abi_cxx11_,pcVar14);
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar15 = this->Makefile;
        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                            ((cmExpandedCommandArgument *)(local_220._M_node + 1));
        pcVar11 = cmMakefile::FindTargetToUse(pcVar15,psVar10,false);
        HandlePredicate((cmConditionEvaluator *)pcVar15,pcVar11 != (cmTarget *)0x0,&local_224,
                        &local_218,newArgs,&local_220,&local_210);
      }
      if (this->Policy64Status < NEW) {
        if ((this->Policy64Status == WARN) &&
           (bVar3 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar14), bVar3)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x40,id);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                               local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     ,0x82);
          pcVar15 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar15,AUTHOR_WARNING,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
        }
      }
      else {
        bVar3 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar14);
        if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
          pcVar15 = this->Makefile;
          pcVar6 = cmExpandedCommandArgument::c_str
                             ((cmExpandedCommandArgument *)(local_220._M_node + 1));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1a8,pcVar6,(allocator<char> *)&local_208);
          pcVar13 = cmMakefile::GetTest(pcVar15,(string *)local_1a8);
          pcVar15 = (cmMakefile *)local_1a8._0_8_;
          if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
          HandlePredicate((cmConditionEvaluator *)pcVar15,pcVar13 != (cmTest *)0x0,&local_224,
                          &local_218,newArgs,&local_220,&local_210);
        }
      }
      iVar2._M_node = local_218._M_node;
      bVar3 = IsKeyword(this,&keyDEFINED_abi_cxx11_,
                        (cmExpandedCommandArgument *)(local_218._M_node + 1));
      if ((bVar3) && (local_220._M_node != (_List_node_base *)newArgs)) {
        pcVar14 = (cmExpandedCommandArgument *)(local_220._M_node + 1);
        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
        uVar1 = psVar10->_M_string_length;
        if (uVar1 < 5) {
          bVar3 = false;
        }
        else {
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
          bVar3 = false;
          std::__cxx11::string::substr((ulong)local_1c8,(ulong)psVar10);
          iVar4 = std::__cxx11::string::compare((char *)local_1c8);
          if (iVar4 == 0) {
            psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
            bVar3 = (psVar10->_M_dataplus)._M_p[uVar1 - 1] == '}';
          }
        }
        if ((4 < uVar1) && (local_1c8[0] != local_1b8)) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        if (bVar3) {
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar10);
          bVar3 = cmsys::SystemTools::HasEnv((string *)local_1a8);
LAB_00356db0:
          pcVar15 = (cmMakefile *)local_1a8._0_8_;
          if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
        }
        else {
          if (uVar1 < 7) {
            bVar3 = false;
          }
          else {
            psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
            bVar3 = false;
            std::__cxx11::string::substr((ulong)local_1e8,(ulong)psVar10);
            iVar4 = std::__cxx11::string::compare((char *)local_1e8);
            if (iVar4 == 0) {
              psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
              bVar3 = (psVar10->_M_dataplus)._M_p[uVar1 - 1] == '}';
            }
          }
          if ((6 < uVar1) && (local_1e8[0] != local_1d8)) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
          if (bVar3) {
            psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
            std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar10);
            pcVar8 = cmMakefile::GetState(this->Makefile);
            pcVar6 = cmState::GetCacheEntryValue(pcVar8,(string *)local_1a8);
            bVar3 = pcVar6 != (char *)0x0;
            goto LAB_00356db0;
          }
          pcVar15 = this->Makefile;
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar14);
          bVar3 = cmMakefile::IsDefinitionSet(pcVar15,psVar10);
        }
        HandlePredicate((cmConditionEvaluator *)pcVar15,bVar3,&local_224,&local_218,newArgs,
                        &local_220,&local_210);
      }
      local_218._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(iVar2._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    }
    if (local_224 == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        MessageType&)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      // does a file exist
      if (this->IsKeyword(keyEXISTS, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileExists(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a directory with this name exist
      if (this->IsKeyword(keyIS_DIRECTORY, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsDirectory(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a symlink with this name exist
      if (this->IsKeyword(keyIS_SYMLINK, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsSymlink(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // is the given path an absolute path ?
      if (this->IsKeyword(keyIS_ABSOLUTE, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsFullPath(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a command exist
      if (this->IsKeyword(keyCOMMAND, *arg) && argP1 != newArgs.end()) {
        cmCommand* command =
          this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(command != nullptr, reducible, arg, newArgs,
                              argP1, argP2);
      }
      // does a policy exist
      if (this->IsKeyword(keyPOLICY, *arg) && argP1 != newArgs.end()) {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(cmPolicies::GetPolicyID(argP1->c_str(), pid),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a target exist
      if (this->IsKeyword(keyTARGET, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue()) != nullptr,
          reducible, arg, newArgs, argP1, argP2);
      }
      // does a test exist
      if (this->Policy64Status != cmPolicies::OLD &&
          this->Policy64Status != cmPolicies::WARN) {
        if (this->IsKeyword(keyTEST, *arg) && argP1 != newArgs.end()) {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(haveTest != nullptr, reducible, arg, newArgs,
                                argP1, argP2);
        }
      } else if (this->Policy64Status == cmPolicies::WARN &&
                 this->IsKeyword(keyTEST, *arg)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      // is a variable defined
      if (this->IsKeyword(keyDEFINED, *arg) && argP1 != newArgs.end()) {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if (argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
            argP1->GetValue().operator[](argP1len - 1) == '}') {
          std::string env = argP1->GetValue().substr(4, argP1len - 5);
          bdef = cmSystemTools::HasEnv(env);
        } else if (argP1len > 6 &&
                   argP1->GetValue().substr(0, 6) == "CACHE{" &&
                   argP1->GetValue().operator[](argP1len - 1) == '}') {
          std::string cache = argP1->GetValue().substr(6, argP1len - 7);
          bdef =
            this->Makefile.GetState()->GetCacheEntryValue(cache) != nullptr;
        } else {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
        }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}